

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O1

graph * __thiscall mpt::convertable::operator_cast_to_graph_(convertable *this)

{
  uint uVar1;
  int iVar2;
  named_traits *pnVar3;
  graph *ptr;
  graph *local_10;
  
  pnVar3 = layout::graph::pointer_traits(true);
  if (pnVar3 == (named_traits *)0x0) {
    uVar1 = 0xfffffffc;
  }
  else {
    uVar1 = (uint)pnVar3->type;
  }
  local_10 = (graph *)0x0;
  if (((int)uVar1 < 1) ||
     (iVar2 = (**this->_vptr_convertable)(this,(ulong)uVar1,&local_10), iVar2 < 0)) {
    local_10 = (graph *)0x0;
  }
  return local_10;
}

Assistant:

mpt::convertable::operator T *()
{
	int type = mpt::type_properties<T *>::id(true);
	T *ptr = 0;
	if ((type <= 0) || (convert(type, &ptr) < 0)) {
		return 0;
	}
	return ptr;
}